

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_perform_upgrade_tls(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  byte bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  ulong in_RAX;
  _Bool ssldone;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  _Var3 = Curl_conn_is_ssl(conn,0);
  if ((!_Var3) && (CVar4 = Curl_ssl_cfilter_add(data,conn,0), CVar4 != CURLE_OK)) {
    return CVar4;
  }
  CVar4 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_18 + 7));
  if (CVar4 == CURLE_OK) {
    *(byte *)((long)&conn->proto + 0xfb) =
         *(byte *)((long)&conn->proto + 0xfb) & 0xfe | uStack_18._7_1_;
    if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
      (data->conn->proto).imapc.state = IMAP_UPGRADETLS;
    }
    bVar2 = *(byte *)((long)&conn->proto + 0xfb);
    CVar4 = CURLE_OK;
    if ((bVar2 & 1) != 0) {
      conn->handler = &Curl_handler_imaps;
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 8;
      *(undefined2 *)((long)&conn->proto + 0xb8) = 0;
      *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
      *(byte *)((long)&conn->proto + 0xfb) = bVar2 & 0xfb;
      CVar4 = imap_sendf(data,"CAPABILITY");
      if (CVar4 == CURLE_OK) {
        (data->conn->proto).imapc.state = IMAP_CAPABILITY;
      }
    }
  }
  return CVar4;
}

Assistant:

static CURLcode imap_perform_upgrade_tls(struct Curl_easy *data,
                                         struct connectdata *conn)
{
  /* Start the SSL connection */
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
  if(!result) {
    imapc->ssldone = ssldone;
    if(imapc->state != IMAP_UPGRADETLS)
      imap_state(data, IMAP_UPGRADETLS);

    if(imapc->ssldone) {
      imap_to_imaps(conn);
      result = imap_perform_capability(data, conn);
    }
  }
out:
  return result;
}